

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall
pbrt::SpectrumCheckerboardTexture::ToString_abi_cxx11_(SpectrumCheckerboardTexture *this)

{
  bool bVar1;
  bool bVar2;
  TaggedPointer *in_RSI;
  string *in_RDI;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  *in_stack_ffffffffffffff58;
  char *pcVar3;
  undefined7 in_stack_ffffffffffffff80;
  byte bVar4;
  char *in_stack_ffffffffffffff88;
  char **in_stack_ffffffffffffffa0;
  string local_38 [32];
  TaggedPointer<pbrt::TransformMapping3D> *local_18;
  
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
    ::ToString_abi_cxx11_(in_stack_ffffffffffffff58);
    pcVar3 = (char *)std::__cxx11::string::c_str();
  }
  else {
    pcVar3 = "(nullptr)";
  }
  bVar4 = 0;
  local_18 = (TaggedPointer<pbrt::TransformMapping3D> *)pcVar3;
  bVar2 = pbrt::TaggedPointer::operator_cast_to_bool(in_RSI + 8);
  if (bVar2) {
    TaggedPointer<pbrt::TransformMapping3D>::ToString_abi_cxx11_
              ((TaggedPointer<pbrt::TransformMapping3D> *)pcVar3);
    bVar4 = 1;
    std::__cxx11::string::c_str();
  }
  pcVar3 = "closed-form";
  if (*(int *)(in_RSI + 0x20) == 0) {
    pcVar3 = "none";
  }
  StringPrintf<char_const*,char_const*,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,char_const*>
            (in_stack_ffffffffffffff88,(char **)CONCAT17(bVar4,in_stack_ffffffffffffff80),
             (char **)pcVar3,(SpectrumTextureHandle *)in_RSI,(SpectrumTextureHandle *)in_RDI,
             in_stack_ffffffffffffffa0);
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_38);
  }
  return in_RDI;
}

Assistant:

std::string SpectrumCheckerboardTexture::ToString() const {
    return StringPrintf("[ SpectrumCheckerboardTexture map2D: %s map3D: %s "
                        "tex[0]: %s tex[1]: %s aaMethod: %s]",
                        map2D ? map2D.ToString().c_str() : "(nullptr)",
                        map3D ? map3D.ToString().c_str() : "(nullptr)", tex[0], tex[1],
                        aaMethod == AAMethod::None ? "none" : "closed-form");
}